

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<32,_151>::ResonanceRange::ResonanceRange
          (ResonanceRange *this,double el,double eh,int naps,ResonanceParameters *parameters,
          optional<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances>
          *scatteringRadius)

{
  ResonanceParameters *this_00;
  bool NRO;
  int NAPS;
  pointer pvVar1;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_ResonanceRange_hpp:74:40),_const_std::variant<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>_&>
  LRU;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_ResonanceRange_hpp:86:40),_const_std::variant<njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>_&>
  LRF;
  anon_class_1_0_00000001 local_32;
  anon_class_1_0_00000001 local_31;
  
  this->el_ = el;
  this->eh_ = eh;
  this->naps_ = naps;
  this_00 = &this->parameters_;
  std::__detail::__variant::
  _Move_ctor_base<false,_njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
  ::_Move_ctor_base((_Move_ctor_base<false,_njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     *)this_00,
                    (_Move_ctor_base<false,_njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     *)parameters);
  (this->scattering_radius_).
  super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_false,_false>
  ._M_payload.
  super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_true,_false,_false>
  .super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances>.
  _M_engaged = false;
  NRO = (scatteringRadius->
        super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_false,_false>
        )._M_payload.
        super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_true,_false,_false>
        .
        super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances>
        ._M_engaged;
  if (NRO == true) {
    pvVar1 = *(pointer *)
              ((long)&(scatteringRadius->
                      super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_false,_false>
                      )._M_payload.
                      super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_true,_false,_false>
                      .
                      super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances>
                      ._M_payload._M_value.ni_.
                      super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
              + 8);
    *(undefined8 *)
     &(this->scattering_radius_).
      super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_false,_false>
      ._M_payload.
      super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_true,_false,_false>
      .
      super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances>
      ._M_payload._M_value.ni_.
      super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
         = *(undefined8 *)
            &(scatteringRadius->
             super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_false,_false>
             )._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_true,_false,_false>
             .
             super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances>
             ._M_payload._M_value.ni_.
             super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
    ;
    *(pointer *)
     ((long)&(this->scattering_radius_).
             super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_false,_false>
             ._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_true,_false,_false>
             .
             super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances>
             ._M_payload._M_value.ni_ + 8) = pvVar1;
    *(pointer *)
     ((long)&(this->scattering_radius_).
             super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_false,_false>
             ._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_true,_false,_false>
             .
             super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances>
             ._M_payload._M_value.ni_ + 0x10) =
         *(pointer *)
          ((long)&(scatteringRadius->
                  super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_false,_false>
                  )._M_payload.
                  super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_true,_false,_false>
                  .
                  super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances>
                  ._M_payload._M_value.ni_.
                  super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
          + 0x10);
    *(undefined8 *)
     &(scatteringRadius->
      super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_false,_false>
      )._M_payload.
      super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_true,_false,_false>
      .
      super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances>
      ._M_payload._M_value.ni_.
      super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
         = 0;
    *(pointer *)
     ((long)&(scatteringRadius->
             super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_false,_false>
             )._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_true,_false,_false>
             .
             super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances>
             ._M_payload._M_value.ni_.
             super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
     + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(scatteringRadius->
             super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_false,_false>
             )._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_true,_false,_false>
             .
             super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances>
             ._M_payload._M_value.ni_.
             super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
     + 0x10) = (pointer)0x0;
    (this->scattering_radius_).
    super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_false,_false>
    ._M_payload.
    super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_true,_false,_false>
    .super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances>
    ._M_engaged = true;
  }
  NAPS = this->naps_;
  LRU = std::
        visit<njoy::ENDFtk::section::Type<32,151>::ResonanceRange::LRU()const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>const&>
                  (&local_32,this_00);
  LRF = std::
        visit<njoy::ENDFtk::section::Type<32,151>::ResonanceRange::LRF()const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<32,151>::LimitedSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::LimitedMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore,njoy::ENDFtk::section::Type<32,151>::GeneralRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactMultiLevelBreitWigner,njoy::ENDFtk::section::Type<32,151>::CompactReichMoore,njoy::ENDFtk::section::Type<32,151>::CompactRMatrixLimited,njoy::ENDFtk::section::Type<32,151>::UnresolvedRelativeCovariances>const&>
                  (&local_31,this_00);
  verifyOptions(NRO,NAPS,LRU,LRF);
  return;
}

Assistant:

ResonanceRange( double el, double eh, int naps,
                ResonanceParameters&& parameters,
                std::optional< ScatteringRadiusCovariances >&& scatteringRadius = std::nullopt )
  try : el_( el ), eh_( eh ), naps_( naps ),
        parameters_( std::move( parameters ) ),
        scattering_radius_( std::move( scatteringRadius ) ) {

    verifyOptions( this->NRO(), this->NAPS(), this->LRU(), this->LRF() );
  }
  catch ( std::exception& e ) {

    Log::info( "Encountered error while constructing a resonance range" );
    throw;
  }